

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_setfenv(lua_State *L)

{
  int iVar1;
  lua_State *L_local;
  
  luaL_checktype(L,2,5);
  lua_settop(L,2);
  iVar1 = lua_setfenv(L,1);
  if (iVar1 == 0) {
    luaL_error(L,"\'setfenv\' cannot change environment of given object");
  }
  return 1;
}

Assistant:

static int db_setfenv (lua_State *L) {
  luaL_checktype(L, 2, LUA_TTABLE);
  lua_settop(L, 2);
  if (lua_setfenv(L, 1) == 0)
    luaL_error(L, LUA_QL("setfenv")
                  " cannot change environment of given object");
  return 1;
}